

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModulesC.cpp
# Opt level: O0

char * SoapySDR_unloadModule(char *path)

{
  char *pcVar1;
  char *in_RDI;
  exception *ex;
  string *in_stack_ffffffffffffff90;
  allocator local_51;
  string local_50 [32];
  string local_30 [32];
  char *local_10;
  string *in_stack_fffffffffffffff8;
  
  local_10 = in_RDI;
  SoapySDRDevice_clearError();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,local_10,&local_51);
  SoapySDR::unloadModule(in_stack_fffffffffffffff8);
  pcVar1 = toCString(in_stack_ffffffffffffff90);
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  return pcVar1;
}

Assistant:

char *SoapySDR_unloadModule(const char *path)
{
    __SOAPY_SDR_C_TRY
    return toCString(SoapySDR::unloadModule(path));
    __SOAPY_SDR_C_CATCH_RET(nullptr);
}